

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

UdpDeclarationSyntax * __thiscall
slang::parsing::Parser::parseUdpDeclaration(Parser *this,AttrList attr)

{
  NamedBlockClauseSyntax *endBlock;
  UdpDeclarationSyntax *pUVar1;
  Token TVar2;
  Token endprimitive;
  Token primitive;
  bool isSequential;
  UdpBodySyntax *local_a8;
  UdpPortListSyntax *local_a0;
  size_t local_98;
  pointer local_90;
  Info *local_88;
  undefined8 local_80;
  Token local_78;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  local_98 = (size_t)attr._M_extent._M_extent_value;
  local_90 = attr._M_ptr;
  TVar2 = ParserBase::consume(&this->super_ParserBase);
  local_88 = TVar2.info;
  local_80 = TVar2._0_8_;
  TVar2 = ParserBase::expect(&this->super_ParserBase,Identifier);
  isSequential = false;
  local_a0 = parseUdpPortList(this,&isSequential);
  local_a8 = parseUdpBody(this,isSequential);
  endprimitive = ParserBase::expect(&this->super_ParserBase,EndPrimitiveKeyword);
  endBlock = parseNamedBlockClause(this);
  checkBlockNames(this,TVar2,endBlock);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.childCount = local_98;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       local_90;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = local_98;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00b667e8;
  primitive.info = local_88;
  primitive.kind = (undefined2)local_80;
  primitive._2_1_ = local_80._2_1_;
  primitive.numFlags.raw = local_80._3_1_;
  primitive.rawLen = local_80._4_4_;
  local_78 = endprimitive;
  pUVar1 = slang::syntax::SyntaxFactory::udpDeclaration
                     (&this->factory,&local_68,primitive,TVar2,local_a0,local_a8,endprimitive,
                      endBlock);
  return pUVar1;
}

Assistant:

UdpDeclarationSyntax& Parser::parseUdpDeclaration(AttrList attr) {
    auto primitive = consume();
    auto name = expect(TokenKind::Identifier);

    bool isSequential = false;
    auto& portList = parseUdpPortList(isSequential);
    auto& body = parseUdpBody(isSequential);
    auto endprim = expect(TokenKind::EndPrimitiveKeyword);

    NamedBlockClauseSyntax* endBlockName = parseNamedBlockClause();
    checkBlockNames(name, endBlockName);

    return factory.udpDeclaration(attr, primitive, name, portList, body, endprim, endBlockName);
}